

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

DataPointer *
duckdb::DataPointer::Deserialize(DataPointer *__return_storage_ptr__,Deserializer *deserializer)

{
  ulong *puVar1;
  CompressionType CVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var5;
  byte bVar6;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var7;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> _Var8;
  BlockPointer BVar9;
  BaseStatistics statistics;
  undefined1 local_f8 [40];
  long local_d0 [9];
  BaseStatistics local_88;
  
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"row_start");
  pp_Var5 = deserializer->_vptr_Deserializer;
  if ((char)uVar3 == '\0') {
    local_f8._16_8_ = (pointer)0x0;
  }
  else {
    iVar4 = (*pp_Var5[0x15])(deserializer);
    local_f8._16_8_ = CONCAT44(extraout_var,iVar4);
    pp_Var5 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var5[5])(deserializer,(ulong)(uVar3 & 0xff));
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"tuple_count");
  pp_Var5 = deserializer->_vptr_Deserializer;
  if ((char)uVar3 == '\0') {
    local_f8._8_8_ = (pointer)0x0;
  }
  else {
    iVar4 = (*pp_Var5[0x15])(deserializer);
    local_f8._8_8_ = CONCAT44(extraout_var_00,iVar4);
    pp_Var5 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var5[5])(deserializer,(ulong)(uVar3 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"block_pointer");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  BVar9 = BlockPointer::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"compression_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_f8 + 0x18,deserializer);
    CVar2 = EnumUtil::FromString<duckdb::CompressionType>((char *)local_f8._24_8_);
    uVar3 = (uint)CVar2;
    if ((long *)local_f8._24_8_ != local_d0) {
      operator_delete((void *)local_f8._24_8_);
    }
  }
  else {
    uVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x68,"statistics");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  BaseStatistics::Deserialize((BaseStatistics *)(local_f8 + 0x18),deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  BaseStatistics::BaseStatistics(&local_88,(BaseStatistics *)(local_f8 + 0x18));
  DataPointer(__return_storage_ptr__,&local_88);
  BaseStatistics::~BaseStatistics(&local_88);
  __return_storage_ptr__->row_start = local_f8._16_8_;
  __return_storage_ptr__->tuple_count = local_f8._8_8_;
  __return_storage_ptr__->block_pointer = BVar9;
  __return_storage_ptr__->compression_type = (CompressionType)uVar3;
  local_f8._0_8_ = ZEXT48(uVar3 & 0xff);
  puVar1 = (deserializer->data).enums.c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (deserializer->data).enums.c.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(deserializer->data).enums.c,(unsigned_long *)local_f8);
  }
  else {
    *puVar1 = local_f8._0_8_;
    (deserializer->data).enums.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"segment_state");
  bVar6 = (byte)iVar4;
  if (bVar6 == 0) {
    _Var7._M_head_impl =
         (__return_storage_ptr__->segment_state).
         super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
         .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
    (__return_storage_ptr__->segment_state).
    super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
    .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
         (ColumnSegmentState *)0x0;
    if (_Var7._M_head_impl == (ColumnSegmentState *)0x0) {
      bVar6 = 0;
      goto LAB_005d4f78;
    }
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar4 == '\0') {
      _Var8._M_head_impl = (ColumnSegmentState *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ColumnSegmentState::Deserialize((ColumnSegmentState *)local_f8,deserializer);
      _Var8._M_head_impl = (ColumnSegmentState *)local_f8._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var7._M_head_impl =
         (__return_storage_ptr__->segment_state).
         super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
         .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl;
    (__return_storage_ptr__->segment_state).
    super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
    .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (_Var7._M_head_impl == (ColumnSegmentState *)0x0) {
      bVar6 = 1;
      goto LAB_005d4f78;
    }
  }
  (*(_Var7._M_head_impl)->_vptr_ColumnSegmentState[1])();
LAB_005d4f78:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar6);
  Deserializer::Unset<duckdb::CompressionType>(deserializer);
  BaseStatistics::~BaseStatistics((BaseStatistics *)(local_f8 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

DataPointer DataPointer::Deserialize(Deserializer &deserializer) {
	auto row_start = deserializer.ReadPropertyWithDefault<uint64_t>(100, "row_start");
	auto tuple_count = deserializer.ReadPropertyWithDefault<uint64_t>(101, "tuple_count");
	auto block_pointer = deserializer.ReadProperty<BlockPointer>(102, "block_pointer");
	auto compression_type = deserializer.ReadProperty<CompressionType>(103, "compression_type");
	auto statistics = deserializer.ReadProperty<BaseStatistics>(104, "statistics");
	DataPointer result(std::move(statistics));
	result.row_start = row_start;
	result.tuple_count = tuple_count;
	result.block_pointer = block_pointer;
	result.compression_type = compression_type;
	deserializer.Set<CompressionType>(compression_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ColumnSegmentState>>(105, "segment_state", result.segment_state);
	deserializer.Unset<CompressionType>();
	return result;
}